

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithVariableNeedingRenamedUnits_Test
::TestBody(Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithVariableNeedingRenamedUnits_Test
           *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_468 [8];
  Message local_460 [8];
  shared_ptr<libcellml::Component> local_458;
  shared_ptr<libcellml::Variable> local_448;
  shared_ptr<libcellml::Units> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_6;
  Message local_3f0 [8];
  shared_ptr<libcellml::Component> local_3e8;
  shared_ptr<libcellml::Variable> local_3d8;
  shared_ptr<libcellml::Units> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_5;
  Message local_380 [8];
  shared_ptr<libcellml::Units> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_4;
  Message local_330 [8];
  shared_ptr<libcellml::Units> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_3;
  Message local_2e0 [8];
  shared_ptr<libcellml::Units> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  Message local_290 [8];
  shared_ptr<libcellml::Units> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_1;
  Message local_240 [8];
  unsigned_long local_238 [2];
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [32];
  undefined1 local_190 [8];
  UnitsPtr u;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  VariablePtr v;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  ComponentPtr ic;
  string local_a8 [32];
  undefined1 local_88 [8];
  ModelPtr model;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ImportSourcePtr import;
  ImporterPtr importer;
  ModelPtr importModel;
  Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithVariableNeedingRenamedUnits_Test
  *this_local;
  
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::create((bool)((char)&import + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"importer/units/base_model.cellml",&local_61);
  createBaseModelImport
            ((ModelPtr *)local_40,
             (string *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"main_model",
             (allocator<char> *)
             ((long)&ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"my_component",&local_e1);
  libcellml::Component::create((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar2 + 0x10));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"my_component",
             (allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar2 + 0x10));
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"R",&local_141);
  libcellml::Variable::create((string *)local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"fmol",&local_169);
  libcellml::Variable::setUnits((string *)peVar3);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::ComponentEntity::component
            ((ulong)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"fmol",&local_1b1);
  libcellml::Units::create((string *)local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"farad",&local_1d9);
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"mole",
             (allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_238[1] = 3;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_238[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_228,"size_t(3)","flatModel->unitsCount()",local_238 + 1,
             local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_240);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_288);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_288);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_258,"\"fmol\"","flatModel->units(0)->name()",
             (char (*) [5])0x18f8aa,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(local_290);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_2d8);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2d8);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_2a8,"\"fmol_1\"","flatModel->units(1)->name()",
             (char (*) [7])"fmol_1",&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(local_2e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_328);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_328);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_2f8,"\"per_fmol\"","flatModel->units(2)->name()",
             (char (*) [9])"per_fmol",&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(local_330);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_378);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_378);
  libcellml::Units::unitAttributeReference_abi_cxx11_((ulong)&local_368);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_348,"\"fmol_1\"",
             "flatModel->units(2)->unitAttributeReference(0)",(char (*) [7])"fmol_1",&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(local_380);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_3e8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3e8);
  libcellml::Component::variable((ulong)&local_3d8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3d8);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3c8);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_398,"\"per_fmol\"",
             "flatModel->component(0)->variable(0)->units()->name()",(char (*) [9])"per_fmol",
             &local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_3c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_458);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_458);
  libcellml::Component::variable((ulong)&local_448);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_448);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_438);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_408,"\"fmol_1\"",
             "flatModel->component(0)->variable(1)->units()->name()",(char (*) [7])"fmol_1",
             &local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_438);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_448);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(local_460);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              (local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xca6,pcVar6);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_190);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_120);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_88);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_40);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithVariableNeedingRenamedUnits)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    libcellml::VariablePtr v = libcellml::Variable::create("R");
    v->setUnits("fmol");
    importModel->component(0)->addVariable(v);

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("farad");
    u->addUnit("mole");

    model->addComponent(ic);
    model->addUnits(u);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(3), flatModel->unitsCount());
    EXPECT_EQ("fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol_1", flatModel->units(1)->name());
    EXPECT_EQ("per_fmol", flatModel->units(2)->name());
    EXPECT_EQ("fmol_1", flatModel->units(2)->unitAttributeReference(0));
    EXPECT_EQ("per_fmol", flatModel->component(0)->variable(0)->units()->name());
    EXPECT_EQ("fmol_1", flatModel->component(0)->variable(1)->units()->name());
}